

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  char *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_>_>
  _Var6;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test> *pPVar7;
  char *pcVar8;
  element_type *peVar9;
  _Alloc_hider _Var10;
  _Alloc_hider value_param;
  byte bVar11;
  bool bVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar15;
  ostream *poVar16;
  size_t sVar17;
  long *plVar18;
  const_iterator cVar19;
  undefined4 extraout_var_01;
  TestFactoryBase *factory;
  undefined4 extraout_var_02;
  pointer psVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  GTestLog GStack_1b8;
  int local_1b4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test> *local_1a8;
  char *local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  element_type *local_190;
  string param_name;
  string local_168;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  long local_118;
  string test_suite_name;
  ParamGenerator<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>
  generator;
  CodeLocation local_c0;
  string local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  CodeLocation local_58;
  long *plVar14;
  
  psVar20 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = this;
  if (psVar20 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar12 = false;
    do {
      local_190 = (psVar20->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      this_00 = (psVar20->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pIVar24 = (local_1a8->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_198 = this_00;
      if (pIVar24 !=
          (local_1a8->instantiations_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::InstantiationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*(code *)pIVar24->generator)(&generator);
          pcVar2 = (code *)pIVar24->name_func;
          pcVar3 = pIVar24->file;
          local_1b4 = pIVar24->line;
          test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
          test_suite_name._M_string_length = 0;
          test_suite_name.field_2._M_local_buf[0] = '\0';
          sVar4 = (pIVar24->name)._M_string_length;
          if (sVar4 != 0) {
            test_param_names._M_t._M_impl._0_8_ =
                 &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar5 = (pIVar24->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&test_param_names,pcVar5,pcVar5 + sVar4);
            std::__cxx11::string::append((char *)&test_param_names);
            std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
            if ((_Base_ptr *)test_param_names._M_t._M_impl._0_8_ !=
                &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)test_param_names._M_t._M_impl._0_8_);
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&test_suite_name,
                     (ulong)(local_190->test_suite_base_name)._M_dataplus._M_p);
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1a0 = pcVar3;
          test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          iVar13 = (*(generator.impl_.
                      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
          plVar14 = (long *)CONCAT44(extraout_var,iVar13);
          local_118 = 0;
          while( true ) {
            iVar13 = (*(generator.impl_.
                        super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
            plVar18 = (long *)CONCAT44(extraout_var_00,iVar13);
            if (plVar14 == plVar18) {
              bVar11 = 0;
            }
            else {
              bVar11 = (**(code **)(*plVar14 + 0x30))(plVar14,plVar18);
              bVar11 = bVar11 ^ 1;
            }
            if (plVar18 != (long *)0x0) {
              (**(code **)(*plVar18 + 8))(plVar18);
            }
            if (bVar11 == 0) break;
            Message::Message((Message *)&local_1b0);
            puVar15 = (undefined4 *)(**(code **)(*plVar14 + 0x28))(plVar14);
            local_168.field_2._M_allocated_capacity = *(undefined8 *)(puVar15 + 4);
            local_168._M_dataplus._M_p._0_4_ = *puVar15;
            local_168._M_dataplus._M_p._4_4_ = puVar15[1];
            local_168._M_string_length._0_4_ = puVar15[2];
            local_168._M_string_length._4_4_ = puVar15[3];
            local_168.field_2._8_8_ = local_118;
            (*pcVar2)(&param_name,&local_168);
            _Var10 = param_name._M_dataplus;
            if (param_name._M_string_length == 0) {
              bVar12 = false;
            }
            else {
              lVar21 = param_name._M_string_length - 1;
              lVar23 = 0;
              do {
                uVar22 = (uint)(byte)_Var10._M_p[lVar23];
                iVar13 = isalnum(uVar22);
                bVar12 = iVar13 != 0 || uVar22 == 0x5f;
                if (iVar13 == 0 && uVar22 != 0x5f) break;
                bVar25 = lVar21 != lVar23;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            bVar12 = IsTrue(bVar12);
            peVar9 = local_190;
            if (!bVar12) {
              GTestLog::GTestLog((GTestLog *)&local_168,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x246);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                         0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                   param_name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' is invalid, in ",0x11);
              pcVar3 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar3,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar18 = (long *)std::ostream::operator<<(poVar16,local_1b4);
              std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
              std::ostream::put((char)plVar18);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)&local_168);
            }
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&test_param_names._M_t,&param_name);
            bVar12 = IsTrue((_Rb_tree_header *)cVar19._M_node ==
                            &test_param_names._M_t._M_impl.super__Rb_tree_header);
            if (!bVar12) {
              GTestLog::GTestLog((GTestLog *)&local_168,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x24a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,param_name._M_dataplus._M_p,
                                   param_name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\', in ",6);
              pcVar3 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar3,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar18 = (long *)std::ostream::operator<<(poVar16,local_1b4);
              std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
              std::ostream::put((char)plVar18);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)&local_168);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&test_param_names,&param_name);
            sVar4 = (peVar9->test_base_name)._M_string_length;
            if (sVar4 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0._M_head_impl + 0x10),
                         (peVar9->test_base_name)._M_dataplus._M_p,sVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b0._M_head_impl + 0x10),"/",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0._M_head_impl + 0x10),param_name._M_dataplus._M_p,
                       param_name._M_string_length);
            _Var10 = test_suite_name._M_dataplus;
            Message::GetString_abi_cxx11_(&local_168,(Message *)&local_1b0);
            pcVar3 = (char *)CONCAT44(local_168._M_dataplus._M_p._4_4_,
                                      local_168._M_dataplus._M_p._0_4_);
            auVar26 = (**(code **)(*plVar14 + 0x28))(plVar14);
            PrintToString<std::tuple<int,int,void(*)(unsigned_char_const*,int,unsigned_char_const*const*,int,unsigned_int*),int>>
                      (&local_98,auVar26._0_8_,auVar26._8_8_);
            value_param._M_p = local_98._M_dataplus._M_p;
            local_c0.file._M_dataplus._M_p = (pointer)&local_c0.file.field_2;
            pcVar5 = (peVar9->code_location).file._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar5,
                       pcVar5 + (peVar9->code_location).file._M_string_length);
            local_c0.line = (peVar9->code_location).line;
            iVar13 = (*(local_1a8->super_ParameterizedTestSuiteInfoBase).
                       _vptr_ParameterizedTestSuiteInfoBase[3])();
            bVar12 = IsTrue(true);
            if (!bVar12) {
              GTestLog::GTestLog(&GStack_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x20e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                         ,0x6a);
              pcVar8 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar8,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,local_1b4);
              GTestLog::~GTestLog(&GStack_1b8);
            }
            bVar12 = IsTrue(true);
            if (!bVar12) {
              GTestLog::GTestLog(&GStack_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x223);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                         ,0x6f);
              pcVar8 = local_1a0;
              if (local_1a0 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_1a0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar8,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,local_1b4);
              GTestLog::~GTestLog(&GStack_1b8);
            }
            _Var6.
            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_*,_false>
            ._M_head_impl =
                 (local_190->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_*,_false>
            ;
            puVar15 = (undefined4 *)(**(code **)(*plVar14 + 0x28))(plVar14);
            local_68 = *(undefined8 *)(puVar15 + 4);
            local_78 = *puVar15;
            uStack_74 = puVar15[1];
            uStack_70 = puVar15[2];
            uStack_6c = puVar15[3];
            factory = (TestFactoryBase *)
                      (**(code **)(*(long *)_Var6.
                                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_*,_false>
                                            ._M_head_impl + 0x10))
                                (_Var6.
                                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>_*,_false>
                                 ._M_head_impl,&local_78);
            MakeAndRegisterTestInfo
                      (_Var10._M_p,pcVar3,(char *)0x0,value_param._M_p,&local_c0,
                       (TypeId)CONCAT44(extraout_var_01,iVar13),
                       anon_unknown.dwarf_259311b::SADTestBase::SetUpTestSuite,
                       anon_unknown.dwarf_259311b::SADTestBase::TearDownTestSuite,factory);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.file._M_dataplus._M_p != &local_c0.file.field_2) {
              operator_delete(local_c0.file._M_dataplus._M_p);
            }
            this_00 = local_198;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_168._M_dataplus._M_p._4_4_,local_168._M_dataplus._M_p._0_4_) !=
                &local_168.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_168._M_dataplus._M_p._4_4_,
                                       local_168._M_dataplus._M_p._0_4_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)param_name._M_dataplus._M_p != &param_name.field_2) {
              operator_delete(param_name._M_dataplus._M_p);
            }
            if (local_1b0._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
            }
            (**(code **)(*plVar14 + 0x18))(plVar14);
            local_118 = local_118 + 1;
            bVar12 = true;
          }
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 8))(plVar14);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&test_param_names._M_t);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)test_suite_name._M_dataplus._M_p != &test_suite_name.field_2) {
            operator_delete(test_suite_name._M_dataplus._M_p);
          }
          if (generator.impl_.
              super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*const_*,_int,_unsigned_int_*),_int>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pIVar24 = pIVar24 + 1;
        } while (pIVar24 !=
                 (local_1a8->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar20 = psVar20 + 1;
    } while (psVar20 !=
             (local_1a8->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar12) {
      return;
    }
  }
  pPVar7 = local_1a8;
  iVar13 = (*(local_1a8->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_1a8);
  paVar1 = &local_58.file.field_2;
  pcVar5 = (pPVar7->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar5,pcVar5 + (pPVar7->code_location_).file._M_string_length);
  local_58.line = (pPVar7->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_02,iVar13),&local_58,
             (pPVar7->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar7->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::SADx3Test>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }